

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

HighsStatus __thiscall HEkk::dualize(HEkk *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  vector<int,_std::allocator<int>_> *__x_01;
  vector<int,std::allocator<int>> *pvVar2;
  vector<int,std::allocator<int>> *pvVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  iterator iVar7;
  iterator iVar8;
  pointer piVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer pdVar12;
  HighsSparseMatrix *this_00;
  HighsInt HVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  vector<double,std::allocator<double>> *pvVar27;
  double one;
  double row_lower;
  double row_upper;
  HighsInt iCol;
  vector<int,_std::allocator<int>_> primal_bound_index;
  vector<double,_std::allocator<double>_> primal_bound_value;
  HighsSparseMatrix extra_columns;
  HighsInt dummy_row;
  HighsSparseMatrix dual_matrix;
  undefined8 local_2c0;
  vector<int,std::allocator<int>> *local_2b8;
  vector<double,std::allocator<double>> *local_2b0;
  vector<double,_std::allocator<double>_> local_2a8;
  vector<int,_std::allocator<int>_> local_288;
  vector<double,_std::allocator<double>_> *local_268;
  vector<double,std::allocator<double>> *local_260;
  vector<int,_std::allocator<int>_> *local_258;
  double local_250;
  void *local_248;
  iterator iStack_240;
  int *local_238;
  vector<int,_std::allocator<int>_> *local_230;
  vector<double,_std::allocator<double>_> *local_228;
  vector<double,std::allocator<double>> *local_220;
  void *local_218;
  iterator iStack_210;
  double *local_208;
  vector<int,std::allocator<int>> *local_1f8;
  undefined8 uStack_1f0;
  HighsSparseMatrix *local_1e0;
  vector<double,_std::allocator<double>_> *local_1d8;
  double local_1d0;
  HighsSparseMatrix local_1c8;
  vector<int,std::allocator<int>> *local_158;
  undefined8 uStack_150;
  vector<int,std::allocator<int>> *local_140;
  vector<int,_std::allocator<int>_> *local_138;
  vector<double,_std::allocator<double>_> *local_130;
  vector<double,std::allocator<double>> *local_128;
  vector<double,std::allocator<double>> *local_120;
  uint local_114;
  undefined8 local_110;
  HighsInt local_108;
  vector<int,_std::allocator<int>_> local_100;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<int,std::allocator<int>> *local_a0;
  HighsInt local_98;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  HVar13 = (this->lp_).num_row_;
  this->original_num_col_ = (this->lp_).num_col_;
  this->original_num_row_ = HVar13;
  local_1e0 = &(this->lp_).a_matrix_;
  HVar13 = HighsSparseMatrix::numNz(local_1e0);
  this->original_num_nz_ = HVar13;
  this->original_offset_ = (this->lp_).offset_;
  local_2b0 = (vector<double,std::allocator<double>> *)&(this->lp_).col_cost_;
  local_1d8 = &this->original_col_cost_;
  std::vector<double,_std::allocator<double>_>::operator=
            (local_1d8,(vector<double,_std::allocator<double>_> *)local_2b0);
  local_260 = (vector<double,std::allocator<double>> *)&(this->lp_).col_lower_;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->original_col_lower_,(vector<double,_std::allocator<double>_> *)local_260);
  pvVar1 = &(this->lp_).col_upper_;
  std::vector<double,_std::allocator<double>_>::operator=(&this->original_col_upper_,pvVar1);
  __x = &(this->lp_).row_lower_;
  local_130 = &this->original_row_lower_;
  std::vector<double,_std::allocator<double>_>::operator=(local_130,__x);
  __x_00 = &(this->lp_).row_upper_;
  local_268 = &this->original_row_upper_;
  std::vector<double,_std::allocator<double>_>::operator=(local_268,__x_00);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_2b0,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_260,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve(__x,(long)this->original_num_col_);
  std::vector<double,_std::allocator<double>_>::reserve(__x_00,(long)this->original_num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_2b0,0);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_260,0);
  local_220 = (vector<double,std::allocator<double>> *)pvVar1;
  std::vector<double,_std::allocator<double>_>::resize(pvVar1,0);
  local_120 = (vector<double,std::allocator<double>> *)__x;
  std::vector<double,_std::allocator<double>_>::resize(__x,0);
  local_128 = (vector<double,std::allocator<double>> *)__x_00;
  std::vector<double,_std::allocator<double>_>::resize(__x_00,0);
  local_108 = (this->lp_).a_matrix_.num_row_;
  local_110._0_4_ = (this->lp_).a_matrix_.format_;
  local_110._4_4_ = (this->lp_).a_matrix_.num_col_;
  local_230 = &(this->lp_).a_matrix_.start_;
  std::vector<int,_std::allocator<int>_>::vector(&local_100,local_230);
  __x_01 = &(this->lp_).a_matrix_.p_end_;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__x_01);
  local_258 = &(this->lp_).a_matrix_.index_;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,local_258);
  local_228 = &(this->lp_).a_matrix_.value_;
  local_138 = __x_01;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,local_228);
  pvVar1 = local_130;
  local_108 = this->original_num_col_;
  iVar14 = this->original_num_row_;
  local_110 = CONCAT44(iVar14,2);
  local_208 = (double *)0x0;
  local_218 = (void *)0x0;
  iStack_210._M_current = (double *)0x0;
  local_238 = (int *)0x0;
  local_248 = (void *)0x0;
  iStack_240._M_current = (int *)0x0;
  local_2c0._0_4_ = 0;
  if (0 < local_108) {
    local_140 = (vector<int,std::allocator<int>> *)&this->upper_bound_col_;
    do {
      lVar15 = (long)(int)local_2c0;
      pvVar2 = (vector<int,std::allocator<int>> *)
               (this->original_col_lower_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar15];
      pvVar3 = (vector<int,std::allocator<int>> *)
               (this->original_col_upper_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar15];
      local_1c8._0_8_ = INFINITY;
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_7ff0000000000000;
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_fff0000000000000;
      if (((double)pvVar2 != (double)pvVar3) || (NAN((double)pvVar2) || NAN((double)pvVar3))) {
        uStack_150 = 0;
        local_2b8 = pvVar3;
        local_1f8 = (vector<int,std::allocator<int>> *)
                    (local_1d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar15];
        local_158 = pvVar2;
        bVar26 = highs_isInfinity(-(double)pvVar2);
        if (bVar26) {
          bVar26 = highs_isInfinity((double)local_2b8);
          if (!bVar26) {
            local_1c8._0_8_ = local_2b8;
            local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1f8;
            goto LAB_0033a3bc;
          }
          local_1c8._0_8_ = (vector<int,std::allocator<int>> *)0x0;
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1f8;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
        }
        else {
          bVar26 = highs_isInfinity((double)local_2b8);
          local_1c8._0_8_ = local_158;
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&DAT_fff0000000000000;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)local_1f8;
          if (!bVar26) {
            iVar8._M_current =
                 (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_140,iVar8,(int *)&local_2c0);
            }
            else {
              *iVar8._M_current = (int)local_2c0;
              (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
          }
        }
      }
      else {
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&DAT_fff0000000000000;
        local_1c8._0_8_ = pvVar2;
LAB_0033a3bc:
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&DAT_7ff0000000000000;
      }
      iVar7._M_current =
           (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_120,iVar7,(double *)&local_2a8);
      }
      else {
        *iVar7._M_current =
             (double)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      iVar7._M_current =
           (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_128,iVar7,(double *)&local_288);
      }
      else {
        *iVar7._M_current =
             (double)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      if (((double)local_1c8._0_8_ != 0.0) || (NAN((double)local_1c8._0_8_))) {
        if (iStack_210._M_current == local_208) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_218,iStack_210,
                     (double *)&local_1c8);
        }
        else {
          *iStack_210._M_current = (double)local_1c8._0_8_;
          iStack_210._M_current = iStack_210._M_current + 1;
        }
        if (iStack_240._M_current == local_238) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_248,iStack_240,(int *)&local_2c0);
        }
        else {
          *iStack_240._M_current = (int)local_2c0;
          iStack_240._M_current = iStack_240._M_current + 1;
        }
      }
      local_2c0._0_4_ = (int)local_2c0 + 1;
    } while ((int)local_2c0 < this->original_num_col_);
    iVar14 = this->original_num_row_;
  }
  local_2c0 = (double)((ulong)local_2c0._4_4_ << 0x20);
  if (0 < iVar14) {
    local_158 = (vector<int,std::allocator<int>> *)&this->upper_bound_row_;
    iVar14 = 0;
    do {
      pvVar2 = (vector<int,std::allocator<int>> *)
               (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar14];
      pvVar3 = (vector<int,std::allocator<int>> *)
               (local_268->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar14];
      local_1c8._0_8_ = INFINITY;
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_7ff0000000000000;
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_fff0000000000000;
      if (((double)pvVar2 != (double)pvVar3) || (NAN((double)pvVar2) || NAN((double)pvVar3))) {
        uStack_1f0 = 0;
        local_2b8 = pvVar3;
        local_1f8 = pvVar2;
        bVar26 = highs_isInfinity(-(double)pvVar2);
        if (bVar26) {
          bVar26 = highs_isInfinity((double)local_2b8);
          if (bVar26) {
            local_1c8._0_8_ = (vector<int,std::allocator<int>> *)0x0;
            local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
          }
          else {
            local_1c8._0_8_ = local_2b8;
            local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&DAT_fff0000000000000;
            local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
          }
        }
        else {
          bVar26 = highs_isInfinity((double)local_2b8);
          local_1c8._0_8_ = local_1f8;
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&DAT_7ff0000000000000;
          if (!bVar26) {
            iVar8._M_current =
                 (this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_158,iVar8,(int *)&local_2c0);
            }
            else {
              *iVar8._M_current = (int)local_2c0;
              (this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
          }
        }
      }
      else {
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&DAT_fff0000000000000;
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&DAT_7ff0000000000000;
        local_1c8._0_8_ = pvVar2;
      }
      iVar7._M_current =
           (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_2b0,iVar7,(double *)&local_1c8);
      }
      else {
        *iVar7._M_current = (double)local_1c8._0_8_;
        (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      iVar7._M_current =
           (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_260,iVar7,(double *)&local_2a8);
      }
      else {
        *iVar7._M_current =
             (double)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      iVar7._M_current =
           (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_220,iVar7,(double *)&local_288);
      }
      else {
        *iVar7._M_current =
             (double)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      iVar14 = (int)local_2c0 + 1;
      local_2c0 = (double)CONCAT44(local_2c0._4_4_,iVar14);
    } while (iVar14 < this->original_num_row_);
  }
  HighsSparseMatrix::HighsSparseMatrix(&local_1c8);
  HighsSparseMatrix::ensureColwise(&local_1c8);
  local_1c8.num_row_ = this->original_num_col_;
  local_2b8 = (vector<int,std::allocator<int>> *)
              ((long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  local_268 = (vector<double,_std::allocator<double>_> *)
              ((ulong)((long)(this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_2c0 = 1.0;
  uVar16 = (uint)local_268;
  if (0 < (int)uVar16) {
    uVar19 = 0;
    do {
      iVar14 = (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      local_250 = (double)CONCAT44(local_250._4_4_,iVar14);
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(this->original_col_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar14];
      HighsSparseMatrix::addVec(&local_1c8,1,(HighsInt *)&local_250,(double *)&local_2c0,1.0);
      iVar7._M_current =
           (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_2b0,iVar7,(double *)&local_2a8);
      }
      else {
        *iVar7._M_current =
             (double)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_fff0000000000000;
      iVar7._M_current =
           (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_260,iVar7,(double *)&local_288);
      }
      else {
        *iVar7._M_current = -INFINITY;
        (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      iVar7._M_current =
           (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_220,iVar7,(double *)&local_288);
      }
      else {
        *iVar7._M_current = 0.0;
        (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      uVar19 = uVar19 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar19);
  }
  pvVar2 = local_2b8;
  uVar19 = (ulong)local_2b8 >> 2;
  uVar16 = (uint)uVar19;
  if (uVar16 != 0) {
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_114 = uVar16;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)&local_2a8,(long)this->original_num_row_,
               (value_type_conflict2 *)&local_114);
    local_250 = (double)((ulong)local_250 & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&local_288,(long)pvVar2 * 0x40000000 + 0x100000000 >> 0x20,
               (value_type_conflict2 *)&local_250);
    if (0 < (int)uVar16) {
      uVar20 = 0;
      do {
        lVar15 = (long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar20];
        *(int *)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar15 * 4) = (int)uVar20;
        local_250 = (this->original_row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar15];
        iVar7._M_current =
             (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_2b0,iVar7,&local_250);
        }
        else {
          *iVar7._M_current = local_250;
          (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        local_1d0 = -INFINITY;
        iVar7._M_current =
             (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_260,iVar7,&local_1d0);
        }
        else {
          *iVar7._M_current = -INFINITY;
          (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        local_1d0 = 0.0;
        iVar7._M_current =
             (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_220,iVar7,&local_1d0);
        }
        else {
          *iVar7._M_current = 0.0;
          (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        uVar20 = uVar20 + 1;
      } while ((uVar16 & 0x7fffffff) != uVar20);
    }
    if (0 < this->original_num_nz_) {
      piVar9 = (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = 0;
      do {
        *(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start +
                (long)*(int *)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start +
                              (long)piVar9[lVar15] * 4) * 4) =
             *(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     (long)*(int *)((long)local_2a8.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                   (long)piVar9[lVar15] * 4) * 4) + 1;
        lVar15 = lVar15 + 1;
      } while (lVar15 < this->original_num_nz_);
    }
    iVar14 = (int)local_268;
    std::vector<int,_std::allocator<int>_>::resize
              (&local_1c8.start_,(long)(int)(iVar14 + uVar16 + 1));
    pvVar1 = local_228;
    if (0 < (int)uVar16) {
      uVar20 = 0;
      do {
        local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)iVar14 + uVar20 + 1] =
             *(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar20 * 4) +
             local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar14 + uVar20];
        *(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar20 * 4) =
             local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar14 + uVar20];
        uVar20 = uVar20 + 1;
      } while ((uVar16 & 0x7fffffff) != uVar20);
    }
    iVar14 = local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)(iVar14 + uVar16)];
    std::vector<int,_std::allocator<int>_>::resize(&local_1c8.index_,(long)iVar14);
    std::vector<double,_std::allocator<double>_>::resize(&local_1c8.value_,(long)iVar14);
    iVar14 = this->original_num_col_;
    if (0 < iVar14) {
      piVar9 = (local_230->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar22 = *piVar9;
      lVar15 = 0;
      do {
        lVar17 = lVar15 + 1;
        iVar18 = piVar9[lVar15 + 1];
        if (iVar22 < iVar18) {
          pdVar11 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar24 = (long)iVar22;
          do {
            iVar14 = *(int *)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                             (long)piVar10[lVar24] * 4);
            if (iVar14 < (int)uVar16) {
              iVar22 = *(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + (long)iVar14 * 4);
              local_1c8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar22] = (int)lVar15;
              local_1c8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar22] = pdVar11[lVar24];
              *(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + (long)iVar14 * 4) =
                   *(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)iVar14 * 4) + 1;
              iVar18 = piVar9[lVar17];
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 < iVar18);
          iVar14 = this->original_num_col_;
        }
        iVar22 = iVar18;
        lVar15 = lVar17;
      } while (lVar17 < iVar14);
    }
    local_1c8.num_col_ = local_1c8.num_col_ + uVar16;
    if ((vector<int,std::allocator<int>> *)
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (vector<int,std::allocator<int>> *)0x0) {
      operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((vector<int,std::allocator<int>> *)
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (vector<int,std::allocator<int>> *)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  this_00 = local_1e0;
  if ((long)iStack_240._M_current - (long)local_248 == 0) {
    pvVar27 = (vector<double,std::allocator<double>> *)0x0;
  }
  else {
    lVar17 = (long)iStack_240._M_current - (long)local_248 >> 2;
    pdVar11 = (local_1d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar9 = (local_230->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar12 = (local_228->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar10 = (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar15 = *(long *)local_2b0;
    pvVar27 = (vector<double,std::allocator<double>> *)0x0;
    lVar24 = 0;
    do {
      lVar25 = (long)*(int *)((long)local_248 + lVar24 * 4);
      dVar4 = *(double *)((long)local_218 + lVar24 * 8);
      dVar5 = pdVar11[lVar25];
      iVar14 = piVar9[lVar25];
      lVar21 = (long)iVar14;
      iVar22 = piVar9[lVar25 + 1];
      if (iVar14 < iVar22) {
        do {
          lVar25 = (long)piVar10[lVar21];
          *(double *)(lVar15 + lVar25 * 8) =
               pdVar12[lVar21] * -dVar4 + *(double *)(lVar15 + lVar25 * 8);
          lVar21 = lVar21 + 1;
        } while (iVar22 != lVar21);
      }
      pvVar27 = (vector<double,std::allocator<double>> *)((double)pvVar27 + dVar5 * dVar4);
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar17 + (ulong)(lVar17 == 0));
  }
  if (local_1c8.num_col_ != 0) {
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_2b0 = pvVar27;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_2a8,(long)this->original_num_col_,(value_type_conflict1 *)&local_288);
    if ((long)iStack_240._M_current - (long)local_248 != 0) {
      lVar15 = (long)iStack_240._M_current - (long)local_248 >> 2;
      lVar17 = 0;
      do {
        *(undefined8 *)
         ((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (long)*(int *)((long)local_248 + lVar17 * 4) * 8)
             = *(undefined8 *)((long)local_218 + lVar17 * 8);
        lVar17 = lVar17 + 1;
      } while (lVar15 + (ulong)(lVar15 == 0) != lVar17);
    }
    if (0 < (long)local_1c8.num_col_) {
      iVar14 = this->original_num_row_;
      pdVar11 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = 0;
      iVar22 = *local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        dVar4 = pdVar11[iVar14 + lVar15];
        iVar18 = local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15 + 1];
        if (iVar22 < iVar18) {
          lVar17 = (long)iVar22;
          do {
            dVar4 = dVar4 - *(double *)
                             ((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                             (long)local_1c8.index_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar17] * 8) *
                            local_1c8.value_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar17];
            lVar17 = lVar17 + 1;
          } while (iVar18 != lVar17);
        }
        pdVar11[iVar14 + lVar15] = dVar4;
        lVar15 = lVar15 + 1;
        iVar22 = iVar18;
      } while (lVar15 != local_1c8.num_col_);
    }
    pvVar27 = local_2b0;
    if ((vector<int,std::allocator<int>> *)
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (vector<int,std::allocator<int>> *)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar27 = local_2b0;
    }
  }
  pvVar1 = local_268;
  (this->lp_).offset_ = (double)pvVar27 + (this->lp_).offset_;
  this_00->num_row_ = local_108;
  this_00->format_ = (undefined4)local_110;
  this_00->num_col_ = local_110._4_4_;
  std::vector<int,_std::allocator<int>_>::operator=(local_230,&local_100);
  std::vector<int,_std::allocator<int>_>::operator=(local_138,&local_e8);
  std::vector<int,_std::allocator<int>_>::operator=(local_258,&local_d0);
  std::vector<double,_std::allocator<double>_>::operator=(local_228,&local_b8);
  HighsSparseMatrix::ensureColwise(this_00);
  local_98 = local_1c8.num_row_;
  local_a0 = (vector<int,std::allocator<int>> *)local_1c8._0_8_;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,&local_1c8.start_);
  std::vector<int,_std::allocator<int>_>::vector(&local_78,&local_1c8.p_end_);
  std::vector<int,_std::allocator<int>_>::vector(&local_60,&local_1c8.index_);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,&local_1c8.value_);
  HighsSparseMatrix::addCols(this_00,(HighsSparseMatrix *)&local_a0,(int8_t *)0x0);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar14 = (int)pvVar1;
  uVar23 = iVar14 + uVar16 + this->original_num_row_;
  bVar26 = (this->lp_).sense_ != kMinimize;
  uVar6 = this->original_num_col_;
  (this->lp_).sense_ = (bVar26 - 1) + (uint)bVar26;
  (this->lp_).num_col_ = uVar23;
  (this->lp_).num_row_ = uVar6;
  (this->status_).is_dualized = true;
  (this->status_).has_basis = false;
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
               "Solving dual LP with %d columns",(ulong)uVar23);
  if (uVar16 + iVar14 == 0) goto LAB_0033b0be;
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," [%d extra from",
               (ulong)(uVar23 - this->original_num_row_));
  if (iVar14 == 0) {
    if (uVar16 != 0) goto LAB_0033b084;
  }
  else {
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                 " %d boxed variable(s)",pvVar1);
    if (uVar16 != 0) {
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," and");
LAB_0033b084:
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                   " %d boxed constraint(s)",uVar19 & 0xffffffff);
    }
  }
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"]");
LAB_0033b0be:
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," and %d rows\n",
               (ulong)uVar6);
  if (local_1c8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1c8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1c8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (int *)0x0) {
    operator_delete(local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_248 != (void *)0x0) {
    operator_delete(local_248);
  }
  if (local_218 != (void *)0x0) {
    operator_delete(local_218);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus HEkk::dualize() {
  assert(lp_.a_matrix_.isColwise());
  original_num_col_ = lp_.num_col_;
  original_num_row_ = lp_.num_row_;
  original_num_nz_ = lp_.a_matrix_.numNz();
  original_offset_ = lp_.offset_;
  original_col_cost_ = lp_.col_cost_;
  original_col_lower_ = lp_.col_lower_;
  original_col_upper_ = lp_.col_upper_;
  original_row_lower_ = lp_.row_lower_;
  original_row_upper_ = lp_.row_upper_;
  // Reserve space for simple dual
  lp_.col_cost_.reserve(original_num_row_);
  lp_.col_lower_.reserve(original_num_row_);
  lp_.col_upper_.reserve(original_num_row_);
  lp_.row_lower_.reserve(original_num_col_);
  lp_.row_upper_.reserve(original_num_col_);
  // Invalidate the original data
  lp_.col_cost_.resize(0);
  lp_.col_lower_.resize(0);
  lp_.col_upper_.resize(0);
  lp_.row_lower_.resize(0);
  lp_.row_upper_.resize(0);
  // The bulk of the constraint matrix of the dual LP is the transpose
  // of the primal constraint matrix. This is obtained row-wise by
  // copying the matrix and flipping the dimensions
  HighsSparseMatrix dual_matrix = lp_.a_matrix_;
  dual_matrix.num_row_ = original_num_col_;
  dual_matrix.num_col_ = original_num_row_;
  dual_matrix.format_ = MatrixFormat::kRowwise;
  // The primal_bound_value vector accumulates the values of the
  // finite bounds on variables - or zero for a free variable - used
  // later to compute the offset and shift for the costs. Many of
  // these components will be zero - all for the case x>=0 - so
  // maintain a list of the nonzeros and corresponding indices. Don't
  // reserve space since they may not be needed
  vector<double> primal_bound_value;
  vector<HighsInt> primal_bound_index;
  const double inf = kHighsInf;
  for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
    const double cost = original_col_cost_[iCol];
    const double lower = original_col_lower_[iCol];
    const double upper = original_col_upper_[iCol];
    double primal_bound = inf;
    double row_lower = inf;
    double row_upper = -inf;
    if (lower == upper) {
      // Fixed
      primal_bound = lower;
      // Dual activity a^Ty is free, implying dual for primal column
      // (slack for dual row) is free
      row_lower = -inf;
      row_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
        // Treat upper bound as additional constraint
        upper_bound_col_.push_back(iCol);
      } else {
        // Lower (since upper bound is infinite)
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      primal_bound = upper;
      // Dual activity a^Ty is bounded below by cost, implying dual
      // for primal column (slack for dual row) is non-positive
      row_lower = cost;
      row_upper = inf;
    } else {
      // FREE
      //
      // Dual activity a^Ty is fixed by cost, implying dual for primal
      // column (slack for dual row) is fixed at zero
      primal_bound = 0;
      row_lower = cost;
      row_upper = cost;
    }
    assert(row_lower < inf);
    assert(row_upper > -inf);
    assert(primal_bound < inf);
    lp_.row_lower_.push_back(row_lower);
    lp_.row_upper_.push_back(row_upper);
    if (primal_bound) {
      primal_bound_value.push_back(primal_bound);
      primal_bound_index.push_back(iCol);
    }
  }
  for (HighsInt iRow = 0; iRow < original_num_row_; iRow++) {
    double lower = original_row_lower_[iRow];
    double upper = original_row_upper_[iRow];
    double col_cost = inf;
    double col_lower = inf;
    double col_upper = -inf;
    if (lower == upper) {
      // Equality constraint
      //
      // Dual variable has primal RHS as cost and is free
      col_cost = lower;
      col_lower = -inf;
      col_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
        // Treat upper bound as additional constraint
        upper_bound_row_.push_back(iRow);
      } else {
        // Lower (since upper bound is infinite)
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      col_cost = upper;
      col_lower = -inf;
      col_upper = 0;
    } else {
      // FREE
      // Shouldn't get free rows, but handle them anyway
      col_cost = 0;
      col_lower = 0;
      col_upper = 0;
    }
    assert(col_lower < inf);
    assert(col_upper > -inf);
    assert(col_cost < inf);
    lp_.col_cost_.push_back(col_cost);
    lp_.col_lower_.push_back(col_lower);
    lp_.col_upper_.push_back(col_upper);
  }
  vector<HighsInt>& start = lp_.a_matrix_.start_;
  vector<HighsInt>& index = lp_.a_matrix_.index_;
  vector<double>& value = lp_.a_matrix_.value_;
  // Boxed variables and constraints yield extra columns in the dual LP
  HighsSparseMatrix extra_columns;
  extra_columns.ensureColwise();
  extra_columns.num_row_ = original_num_col_;
  HighsInt num_upper_bound_col = upper_bound_col_.size();
  HighsInt num_upper_bound_row = upper_bound_row_.size();
  double one = 1;
  for (HighsInt iX = 0; iX < num_upper_bound_col; iX++) {
    HighsInt iCol = upper_bound_col_[iX];
    const double upper = original_col_upper_[iCol];
    extra_columns.addVec(1, &iCol, &one);
    lp_.col_cost_.push_back(upper);
    lp_.col_lower_.push_back(-inf);
    lp_.col_upper_.push_back(0);
  }

  if (num_upper_bound_row) {
    // Need to identify the submatrix of constraint matrix rows
    // corresponding to those with a row index in
    // upper_bound_row_. When identifying numbers of entries in each
    // row of submatrix, use indirection to get corresponding row
    // index, with a dummy row for rows not in the submatrix.
    HighsInt dummy_row = num_upper_bound_row;
    vector<HighsInt> indirection;
    vector<HighsInt> count;
    indirection.assign(original_num_row_, dummy_row);
    count.assign(num_upper_bound_row + 1, 0);
    HighsInt extra_iRow = 0;
    for (HighsInt iX = 0; iX < num_upper_bound_row; iX++) {
      HighsInt iRow = upper_bound_row_[iX];
      indirection[iRow] = extra_iRow++;
      double upper = original_row_upper_[iRow];
      lp_.col_cost_.push_back(upper);
      lp_.col_lower_.push_back(-inf);
      lp_.col_upper_.push_back(0);
    }
    for (HighsInt iEl = 0; iEl < original_num_nz_; iEl++)
      count[indirection[index[iEl]]]++;
    extra_columns.start_.resize(num_upper_bound_col + num_upper_bound_row + 1);
    for (HighsInt iRow = 0; iRow < num_upper_bound_row; iRow++) {
      extra_columns.start_[num_upper_bound_col + iRow + 1] =
          extra_columns.start_[num_upper_bound_col + iRow] + count[iRow];
      count[iRow] = extra_columns.start_[num_upper_bound_col + iRow];
    }
    HighsInt extra_columns_num_nz =
        extra_columns.start_[num_upper_bound_col + num_upper_bound_row];
    extra_columns.index_.resize(extra_columns_num_nz);
    extra_columns.value_.resize(extra_columns_num_nz);
    for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
      for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++) {
        HighsInt iRow = indirection[index[iEl]];
        if (iRow < num_upper_bound_row) {
          HighsInt extra_columns_iEl = count[iRow];
          assert(extra_columns_iEl < extra_columns_num_nz);
          extra_columns.index_[extra_columns_iEl] = iCol;
          extra_columns.value_[extra_columns_iEl] = value[iEl];
          count[iRow]++;
        }
      }
    }
    extra_columns.num_col_ += num_upper_bound_row;
  }
  // Incorporate the cost shift by subtracting A*primal_bound from the
  // cost vector; compute the objective offset
  double delta_offset = 0;
  for (size_t iX = 0; iX < primal_bound_index.size(); iX++) {
    HighsInt iCol = primal_bound_index[iX];
    double multiplier = primal_bound_value[iX];
    delta_offset += multiplier * original_col_cost_[iCol];
    for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
      lp_.col_cost_[index[iEl]] -= multiplier * value[iEl];
  }
  if (extra_columns.num_col_) {
    // Incorporate the cost shift by subtracting
    // extra_columns*primal_bound from the cost vector for the extra
    // dual variables
    //
    // Have to scatter the packed primal bound values into a
    // full-length vector
    //
    // ToDo Make this more efficient?
    vector<double> primal_bound;
    primal_bound.assign(original_num_col_, 0);
    for (size_t iX = 0; iX < primal_bound_index.size(); iX++)
      primal_bound[primal_bound_index[iX]] = primal_bound_value[iX];

    for (HighsInt iCol = 0; iCol < extra_columns.num_col_; iCol++) {
      double cost = lp_.col_cost_[original_num_row_ + iCol];
      for (HighsInt iEl = extra_columns.start_[iCol];
           iEl < extra_columns.start_[iCol + 1]; iEl++)
        cost -=
            primal_bound[extra_columns.index_[iEl]] * extra_columns.value_[iEl];
      lp_.col_cost_[original_num_row_ + iCol] = cost;
    }
  }
  lp_.offset_ += delta_offset;
  // Copy the row-wise dual LP constraint matrix and transpose it.
  // ToDo Make this more efficient
  lp_.a_matrix_ = dual_matrix;
  lp_.a_matrix_.ensureColwise();
  // Add the extra columns to the dual LP constraint matrix
  lp_.a_matrix_.addCols(extra_columns);

  HighsInt dual_num_col =
      original_num_row_ + num_upper_bound_col + num_upper_bound_row;
  HighsInt dual_num_row = original_num_col_;
  assert(dual_num_col == (int)lp_.col_cost_.size());
  assert(lp_.a_matrix_.num_col_ == dual_num_col);
  const bool ignore_scaling = true;
  if (!ignore_scaling) {
    // Flip any scale factors
    if (lp_.scale_.has_scaling) {
      std::vector<double> temp_scale = lp_.scale_.row;
      lp_.scale_.row = lp_.scale_.col;
      lp_.scale_.col = temp_scale;
      lp_.scale_.num_col = dual_num_col;
      lp_.scale_.num_row = dual_num_row;
    }
  }
  // Change optimization sense
  if (lp_.sense_ == ObjSense::kMinimize) {
    lp_.sense_ = ObjSense::kMaximize;
  } else {
    lp_.sense_ = ObjSense::kMinimize;
  }
  // Flip LP dimensions
  lp_.num_col_ = dual_num_col;
  lp_.num_row_ = dual_num_row;
  status_.is_dualized = true;
  status_.has_basis = false;
  status_.has_ar_matrix = false;
  status_.has_nla = false;
  highsLogUser(options_->log_options, HighsLogType::kInfo,
               "Solving dual LP with %d columns", (int)dual_num_col);
  if (num_upper_bound_col + num_upper_bound_row) {
    highsLogUser(options_->log_options, HighsLogType::kInfo, " [%d extra from",
                 (int)dual_num_col - original_num_row_);
    if (num_upper_bound_col)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed variable(s)", (int)num_upper_bound_col);
    if (num_upper_bound_col && num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo, " and");
    if (num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed constraint(s)", (int)num_upper_bound_row);
    highsLogUser(options_->log_options, HighsLogType::kInfo, "]");
  }
  highsLogUser(options_->log_options, HighsLogType::kInfo, " and %d rows\n",
               (int)dual_num_row);
  //  reportLp(options_->log_options, lp_, HighsLogType::kVerbose);
  return HighsStatus::kOk;
}